

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O3

void __thiscall BRTS<UFPC>::SecondScan(BRTS<UFPC> *this)

{
  Run *pRVar1;
  uint uVar2;
  Mat1i *pMVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint *puVar8;
  Run *pRVar9;
  long lVar10;
  long lVar11;
  unsigned_short uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int iVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  int iVar21;
  undefined1 auVar20 [16];
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar16 = (long)*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  puVar8 = UFPC::P_;
  auVar7 = _DAT_00328440;
  auVar6 = _DAT_00328430;
  auVar5 = _DAT_00328420;
  if (0 < lVar16) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    pRVar9 = (this->data_runs).runs;
    lVar4 = **(long **)&pMVar3->field_0x48;
    lVar10 = *(long *)&pMVar3->field_0x10 + 8;
    lVar11 = 0;
    do {
      uVar12 = pRVar9->start_pos;
      while (uVar12 != 0xffff) {
        if (uVar12 < pRVar9->end_pos) {
          uVar2 = puVar8[pRVar9->label];
          lVar13 = (ulong)pRVar9->end_pos - (ulong)uVar12;
          lVar14 = lVar13 + -1;
          auVar17._8_4_ = (int)lVar14;
          auVar17._0_8_ = lVar14;
          auVar17._12_4_ = (int)((ulong)lVar14 >> 0x20);
          lVar14 = lVar10 + (ulong)uVar12 * 4;
          auVar17 = auVar17 ^ auVar7;
          uVar15 = 0;
          do {
            auVar19._8_4_ = (int)uVar15;
            auVar19._0_8_ = uVar15;
            auVar19._12_4_ = (int)(uVar15 >> 0x20);
            auVar20 = (auVar19 | auVar6) ^ auVar7;
            iVar18 = auVar17._4_4_;
            if ((bool)(~(iVar18 < auVar20._4_4_ ||
                        auVar17._0_4_ < auVar20._0_4_ && auVar20._4_4_ == iVar18) & 1)) {
              *(uint *)(lVar14 + -8 + uVar15 * 4) = uVar2;
            }
            if (auVar20._12_4_ <= auVar17._12_4_ &&
                (auVar20._8_4_ <= auVar17._8_4_ || auVar20._12_4_ != auVar17._12_4_)) {
              *(uint *)(lVar14 + -4 + uVar15 * 4) = uVar2;
            }
            auVar19 = (auVar19 | auVar5) ^ auVar7;
            iVar21 = auVar19._4_4_;
            if (iVar21 <= iVar18 && (iVar21 != iVar18 || auVar19._0_4_ <= auVar17._0_4_)) {
              *(uint *)(lVar14 + uVar15 * 4) = uVar2;
              *(uint *)(lVar14 + 4 + uVar15 * 4) = uVar2;
            }
            uVar15 = uVar15 + 4;
          } while ((lVar13 + 3U & 0xfffffffffffffffc) != uVar15);
        }
        pRVar1 = pRVar9 + 1;
        pRVar9 = pRVar9 + 1;
        uVar12 = pRVar1->start_pos;
      }
      pRVar9 = pRVar9 + 1;
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + lVar4;
    } while (lVar11 != lVar16);
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) labels[j] = label;
            }
        }
    }